

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void __thiscall QFormLayout::~QFormLayout(QFormLayout *this)

{
  QFormLayoutPrivate *this_00;
  undefined8 *in_RDI;
  QLayout *unaff_retaddr;
  QFormLayoutPrivate *d;
  
  *in_RDI = &PTR_metaObject_00d0d408;
  in_RDI[2] = &PTR__QFormLayout_00d0d520;
  this_00 = d_func((QFormLayout *)0x4b5b5a);
  QList<QFormLayoutItem_*>::clear((QList<QFormLayoutItem_*> *)this_00);
  QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::storage(&this_00->m_matrix);
  qDeleteAll<QList<QFormLayoutItem*>>((QList<QFormLayoutItem_*> *)this_00);
  QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::clear
            ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)0x4b5b9a);
  QLayout::~QLayout(unaff_retaddr);
  return;
}

Assistant:

QFormLayout::~QFormLayout()
{
    Q_D(QFormLayout);

    /*
        The clearing and destruction order here is important. We start by clearing
        m_things so that QLayout and the rest of the world know that we don't babysit
        the layout items anymore and don't care if they are destroyed.
    */
    d->m_things.clear();
    qDeleteAll(d->m_matrix.storage());
    d->m_matrix.clear();
}